

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_tokenize.c
# Opt level: O0

int read_ident(C_Parser *tokenizer,char *start)

{
  _Bool _Var1;
  char *local_38;
  char *q;
  char *pcStack_28;
  uint32_t c;
  char *p;
  char *start_local;
  C_Parser *tokenizer_local;
  
  pcStack_28 = start;
  p = start;
  start_local = (char *)tokenizer;
  q._4_4_ = C_decode_utf8(tokenizer,&stack0xffffffffffffffd8,start);
  _Var1 = C_is_ident1(q._4_4_);
  if (_Var1) {
    while( true ) {
      q._4_4_ = C_decode_utf8((C_Parser *)start_local,&local_38,pcStack_28);
      _Var1 = C_is_ident2(q._4_4_);
      if (!_Var1) break;
      pcStack_28 = local_38;
    }
    tokenizer_local._4_4_ = (int)pcStack_28 - (int)p;
  }
  else {
    tokenizer_local._4_4_ = 0;
  }
  return tokenizer_local._4_4_;
}

Assistant:

static int read_ident(C_Parser *tokenizer, char *start) {
  char *p = start;
  uint32_t c = C_decode_utf8(tokenizer, &p, p);
  if (!C_is_ident1(c))
    return 0;

  for (;;) {
    char *q;
    c = C_decode_utf8(tokenizer, &q, p);
    if (!C_is_ident2(c))
      return p - start;
    p = q;
  }
}